

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

string * __thiscall
absl::lts_20240722::FormatTime_abi_cxx11_
          (string *__return_storage_ptr__,lts_20240722 *this,string_view format,Time t,TimeZone tz)

{
  Time t_00;
  Time lhs;
  uint32_t uVar1;
  bool bVar2;
  HiRep HVar3;
  undefined4 in_register_0000008c;
  Time TVar4;
  allocator<char> local_151;
  string local_150 [32];
  HiRep local_130;
  uint32_t local_128;
  HiRep local_120;
  uint32_t local_118;
  undefined1 local_110 [8];
  cctz_parts parts;
  allocator<char> local_99;
  HiRep local_98;
  uint32_t local_90;
  HiRep local_88;
  uint32_t local_80;
  Duration local_78;
  HiRep local_64;
  uint32_t local_5c;
  HiRep local_58;
  uint32_t local_50;
  TimeZone local_48;
  TimeZone tz_local;
  Time t_local;
  string_view format_local;
  
  HVar3 = (HiRep)format._M_str;
  local_50 = t.rep_.rep_hi_.lo_;
  local_48._4_4_ = in_register_0000008c;
  local_48._0_4_ = t.rep_.rep_lo_;
  local_58 = HVar3;
  tz_local = (TimeZone)HVar3;
  t_local.rep_.rep_hi_.lo_ = local_50;
  unique0x100002c1 = this;
  local_78 = (Duration)InfiniteFuture();
  local_64 = local_78.rep_hi_;
  local_5c = local_78.rep_lo_;
  local_88 = local_58;
  local_80 = local_50;
  TVar4.rep_.rep_lo_ = local_50;
  TVar4.rep_.rep_hi_ = local_58;
  local_98 = local_78.rep_hi_;
  local_90 = local_78.rep_lo_;
  bVar2 = operator==(TVar4,(Time)local_78);
  uVar1 = t_local.rep_.rep_hi_.lo_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"infinite-future",&local_99);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    TVar4 = InfinitePast();
    lhs.rep_.rep_lo_ = uVar1;
    lhs.rep_.rep_hi_ = HVar3;
    bVar2 = operator==(lhs,TVar4);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"infinite-past",
                 (allocator<char> *)((long)&parts.fem.__r + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&parts.fem.__r + 7));
    }
    else {
      local_118 = t_local.rep_.rep_hi_.lo_;
      local_128 = t_local.rep_.rep_hi_.lo_;
      t_00.rep_.rep_lo_ = t_local.rep_.rep_hi_.lo_;
      t_00.rep_.rep_hi_ = HVar3;
      local_130 = HVar3;
      local_120 = HVar3;
      _local_110 = anon_unknown_6::Split(t_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_150,(basic_string_view<char,_std::char_traits<char>_> *)&t_local.rep_.rep_lo_
                 ,&local_151);
      TimeZone::operator_cast_to_time_zone(&local_48);
      absl::lts_20240722::time_internal::cctz::detail::format
                ((string *)__return_storage_ptr__,(time_point *)local_150,(duration *)local_110,
                 (time_zone *)&parts);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator(&local_151);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTime(absl::string_view format, absl::Time t,
                       absl::TimeZone tz) {
  if (t == absl::InfiniteFuture()) return std::string(kInfiniteFutureStr);
  if (t == absl::InfinitePast()) return std::string(kInfinitePastStr);
  const auto parts = Split(t);
  return cctz::detail::format(std::string(format), parts.sec, parts.fem,
                              cctz::time_zone(tz));
}